

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O1

int SUNQRAdd_ICWY_SB(N_Vector *Q,realtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  uint uVar1;
  realtype *prVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  realtype *prVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double *pdVar12;
  ulong uVar13;
  realtype rVar14;
  double dVar15;
  
  N_VScale(1.0,df,*QRdata);
  if (0 < m) {
    uVar1 = m - 1;
    iVar4 = uVar1 * mMax;
    lVar3 = (long)iVar4 * 8;
    N_VDotProdMultiLocal(m,Q[uVar1],Q,(realtype *)(*(long *)((long)QRdata + 0x10) + lVar3));
    uVar11 = (ulong)(uint)m;
    N_VDotProdMultiLocal
              (m,*QRdata,Q,(realtype *)(*(long *)((long)QRdata + 0x10) + lVar3 + uVar11 * 8));
    N_VDotProdMultiAllReduce(m * 2,*QRdata,(realtype *)(lVar3 + *(long *)((long)QRdata + 0x10)));
    lVar3 = *(long *)((long)QRdata + 0x10);
    prVar2 = R + mMax * m;
    uVar5 = 0;
    do {
      prVar2[uVar5] = *(realtype *)((long)(iVar4 + m) * 8 + lVar3 + uVar5 * 8);
      uVar5 = uVar5 + 1;
    } while (uVar11 != uVar5);
    lVar3 = *(long *)((long)QRdata + 0x10);
    *(undefined8 *)(lVar3 + (long)(int)(iVar4 + uVar1) * 8) = 0x3ff0000000000000;
    lVar7 = (long)mMax;
    pdVar6 = (double *)(lVar3 + lVar7 * 8);
    uVar5 = uVar11;
    prVar8 = prVar2;
    uVar9 = 0;
    do {
      uVar10 = uVar9 + 1;
      if (uVar10 < uVar11) {
        uVar13 = 1;
        pdVar12 = pdVar6;
        do {
          prVar8[uVar13] = prVar8[uVar13] - prVar2[uVar9] * *pdVar12;
          uVar13 = uVar13 + 1;
          pdVar12 = pdVar12 + lVar7;
        } while (uVar5 != uVar13);
      }
      prVar8 = prVar8 + 1;
      pdVar6 = pdVar6 + lVar7 + 1;
      uVar5 = uVar5 - 1;
      uVar9 = uVar10;
    } while (uVar10 != uVar11);
    N_VLinearCombination(m,R + mMax * m,Q,*(N_Vector *)((long)QRdata + 8));
    N_VLinearSum(1.0,*QRdata,-1.0,*(N_Vector *)((long)QRdata + 8),*QRdata);
  }
  rVar14 = N_VDotProd(*QRdata,*QRdata);
  dVar15 = 0.0;
  if (0.0 < rVar14) {
    rVar14 = N_VDotProd(*QRdata,*QRdata);
    if (rVar14 < 0.0) {
      dVar15 = sqrt(rVar14);
    }
    else {
      dVar15 = SQRT(rVar14);
    }
  }
  R[(mMax + 1) * m] = dVar15;
  N_VScale(1.0 / dVar15,*QRdata,Q[m]);
  return 0;
}

Assistant:

int SUNQRAdd_ICWY_SB(N_Vector *Q, realtype *R, N_Vector df,
                     int m, int mMax, void *QRdata)
{
    sunindextype j, k;
    SUNQRData qrdata = (SUNQRData) QRdata;

    N_VScale(ONE, df, qrdata->vtemp); /* stores d_fi in temp */

    if (m > 0) {
      /* T(1:k-1,k-1)^T = Q(:,1:k-1)^T * Q(:,k-1) */
      N_VDotProdMultiLocal(m, Q[m-1], Q, qrdata->temp_array + (m-1) * mMax);

      /* R(1:k-1,k) = Q_k-1^T * df */
      /* Put R values at end of temp_array */
      N_VDotProdMultiLocal(m, qrdata->vtemp, Q, qrdata->temp_array + (m-1) * mMax + m );
      N_VDotProdMultiAllReduce(m+m, qrdata->vtemp, qrdata->temp_array + (m-1) * mMax);

      /* Move the last values from temp array into R */
      for (k = 0; k < m; k++) {
        R[m*mMax + k] = qrdata->temp_array[(m-1)*mMax + m + k];
      }

      /* T(k-1,k-1) = 1.0 */
      qrdata->temp_array[(m-1) * mMax + (m-1)] = ONE;

      /* Solve T^T * R(1:k-1,k) = R(1:k-1,k) */
      for (k = 0; k < m; k++) {
        /* Skip setting the diagonal element because it doesn't change */
        for (j = k+1; j < m; j++) {
          R[m * mMax + j] -= R[m * mMax + k] * qrdata->temp_array[j * mMax + k];
        }
      }
      /* end */

      /* Q(:,k-1) = df - Q_k-1 R(1:k-1,k) */
      N_VLinearCombination(m, R + m * mMax, Q, qrdata->vtemp2);
      N_VLinearSum(ONE, qrdata->vtemp, -ONE, qrdata->vtemp2, qrdata->vtemp);
    }

    /* R(k,k) = \| df \| */
    R[m * mMax + m] = SUNRsqrt(N_VDotProd(qrdata->vtemp, qrdata->vtemp));
    /* Q(:,k) = df / \| df \| */
    N_VScale((1/R[m * mMax + m]), qrdata->vtemp, Q[m]);

    /* Return success */
    return 0;
}